

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

void nlohmann::adl_serializer<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>::
     to_json(json *aJson,ByteArray *aBuf)

{
  ByteArray *in_RDX;
  string local_48;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  local_28;
  ByteArray *local_18;
  ByteArray *aBuf_local;
  json *aJson_local;
  
  local_18 = aBuf;
  aBuf_local = (ByteArray *)aJson;
  ot::commissioner::utils::Hex_abi_cxx11_(&local_48,(utils *)aBuf,in_RDX);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::
  basic_json<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (&local_28,&local_48);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::operator=((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
               *)aBuf_local,&local_28);
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
  ::~basic_json(&local_28);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

static void to_json(json &aJson, const ot::commissioner::ByteArray &aBuf)
    {
        aJson = ot::commissioner::utils::Hex(aBuf);
    }